

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O2

void __thiscall
slang::analysis::AnalysisManager::AnalysisManager(AnalysisManager *this,AnalysisOptions options)

{
  size_t i;
  ulong uVar1;
  
  uVar1 = options._0_8_;
  (this->options).flags = (bitmask<slang::analysis::AnalysisFlags>)(int)uVar1;
  (this->options).numThreads = (int)(uVar1 >> 0x20);
  (this->options).maxCaseAnalysisSteps = options.maxCaseAnalysisSteps;
  (this->workerStates).
  super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workerStates).
  super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->workerStates).
  super__Vector_base<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::unordered::
  concurrent_flat_map<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::concurrent_flat_map(&this->analyzedScopes);
  BS::thread_pool<(unsigned_char)'\x00'>::thread_pool(&this->threadPool,uVar1 >> 0x20);
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->pendingException)._M_exception_object = (void *)0x0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  std::
  vector<slang::analysis::AnalysisManager::WorkerState,_std::allocator<slang::analysis::AnalysisManager::WorkerState>_>
  ::reserve(&this->workerStates,(this->threadPool).thread_count + 1);
  for (uVar1 = 0; uVar1 < (this->threadPool).thread_count + 1; uVar1 = uVar1 + 1) {
    std::
    vector<slang::analysis::AnalysisManager::WorkerState,std::allocator<slang::analysis::AnalysisManager::WorkerState>>
    ::emplace_back<slang::analysis::AnalysisManager&>
              ((vector<slang::analysis::AnalysisManager::WorkerState,std::allocator<slang::analysis::AnalysisManager::WorkerState>>
                *)&this->workerStates,this);
  }
  return;
}

Assistant:

AnalysisManager::AnalysisManager(AnalysisOptions options) :
    options(options), threadPool(options.numThreads) {

    workerStates.reserve(threadPool.get_thread_count() + 1);
    for (size_t i = 0; i < threadPool.get_thread_count() + 1; i++)
        workerStates.emplace_back(*this);
}